

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O2

void easm_del_expr(easm_expr *expr)

{
  long lVar1;
  long lVar2;
  
  if (expr != (easm_expr *)0x0) {
    lVar1 = 0;
    for (lVar2 = 0; lVar2 < expr->swizzlesnum; lVar2 = lVar2 + 1) {
      free(*(void **)((long)&expr->swizzles->str + lVar1));
      lVar1 = lVar1 + 0x10;
    }
    free(expr->swizzles);
    easm_del_expr(expr->e1);
    easm_del_expr(expr->e2);
    free((expr->astr).str);
    free(expr->str);
    easm_del_sinsn(expr->sinsn);
    easm_del_mods(expr->mods);
    free(expr);
    return;
  }
  return;
}

Assistant:

void easm_del_expr(struct easm_expr *expr) {
	if (!expr) return;
	int i;
	for (i = 0; i < expr->swizzlesnum; i++)
		free(expr->swizzles[i].str);
	free(expr->swizzles);
	easm_del_expr(expr->e1);
	easm_del_expr(expr->e2);
	free(expr->astr.str);
	free(expr->str);
	easm_del_sinsn(expr->sinsn);
	easm_del_mods(expr->mods);
	free(expr);
}